

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O1

string * __thiscall
BeliefSparse::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,BeliefSparse *this)

{
  ostream *poVar1;
  BS *this_00;
  BScit it;
  stringstream ss;
  long local_1e0;
  long local_1d8;
  long local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]< ",3);
  this_00 = &this->_m_b;
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::find(this_00,0);
  while( true ) {
    boost::numeric::ublas::
    compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::find(this_00,this_00->size_);
    if (local_1d8 == local_1c0) break;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    poVar1 = std::ostream::_M_insert<double>
                       (*(double *)
                         (*(long *)(local_1e0 + 0x40) + (local_1d8 - *(long *)(local_1e0 + 0x28))));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    local_1d8 = local_1d8 + 8;
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,">",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string BeliefSparse::SoftPrint() const
{
#if BeliefSparse_CheckAndAbort
    if(!SanityCheck())
        abort();
#endif
    stringstream ss;
    ss << "[" << _m_b.size() << "]< ";
    for(BScit it=_m_b.begin();
        it!=_m_b.end(); ++it)
        ss << it.index() << ":" << *it << " ";
    ss << ">";
    return(ss.str());
}